

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

void check_string(archive *a,archive_mstring *mstr,archive_string_conv *sc,char *exp,wchar_t *wexp)

{
  size_t v1;
  wchar_t wVar1;
  size_t v2;
  size_t local_b0;
  size_t len;
  wchar_t *wp;
  char *p;
  archive_mstring mstr2;
  wchar_t *wexp_local;
  char *exp_local;
  archive_string_conv *sc_local;
  archive_mstring *mstr_local;
  archive *a_local;
  
  wp = (wchar_t *)0x0;
  len = 0;
  local_b0 = 0;
  mstr2._96_8_ = wexp;
  memset(&p,0,0x68);
  archive_mstring_copy((archive_mstring *)&p,mstr);
  wVar1 = archive_mstring_get_mbs((archive_conflict *)a,(archive_mstring *)&p,(char **)&wp);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̗',0,"0",(long)wVar1,"archive_mstring_get_mbs(a, &mstr2, &p)",(void *)0x0)
  ;
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̘',exp,"exp",(char *)wp,"p",(void *)0x0,L'\0');
  wp = (wchar_t *)0x0;
  archive_mstring_copy((archive_mstring *)&p,mstr);
  wVar1 = archive_mstring_get_utf8((archive_conflict *)a,(archive_mstring *)&p,(char **)&wp);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̜',0,"0",(long)wVar1,"archive_mstring_get_utf8(a, &mstr2, &p)",(void *)0x0
                     );
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̝',exp,"exp",(char *)wp,"p",(void *)0x0,L'\0');
  wp = (wchar_t *)0x0;
  archive_mstring_copy((archive_mstring *)&p,mstr);
  wVar1 = archive_mstring_get_wcs((archive_conflict *)a,(archive_mstring *)&p,(wchar_t **)&len);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̡',0,"0",(long)wVar1,"archive_mstring_get_wcs(a, &mstr2, &wp)",(void *)0x0
                     );
  assertion_equal_wstring
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̢',(wchar_t *)mstr2._96_8_,"wexp",(wchar_t *)len,"wp",(void *)0x0);
  len = 0;
  archive_mstring_copy((archive_mstring *)&p,mstr);
  wVar1 = archive_mstring_get_mbs_l
                    ((archive_conflict *)a,(archive_mstring *)&p,(char **)&wp,&local_b0,sc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̦',0,"0",(long)wVar1,"archive_mstring_get_mbs_l(a, &mstr2, &p, &len, sc)",
                      (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̧',exp,"exp",(char *)wp,"p",(void *)0x0,L'\0');
  v1 = local_b0;
  v2 = strlen(exp);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̨',v1,"len",v2,"strlen(exp)",(void *)0x0);
  wp = (wchar_t *)0x0;
  local_b0 = 0;
  archive_mstring_clean((archive_mstring *)&p);
  return;
}

Assistant:

static void
check_string(struct archive *a, struct archive_mstring *mstr, struct archive_string_conv *sc,
  const char *exp, const wchar_t *wexp)
{
	/* Do all the tests on a copy so that we can have a clear initial state every time */
	struct archive_mstring mstr2;
	const char *p = NULL;
	const wchar_t *wp = NULL;
	size_t len = 0;

	memset(&mstr2, 0, sizeof(mstr2));

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_mbs(a, &mstr2, &p));
	assertEqualString(exp, p);
	p = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_utf8(a, &mstr2, &p));
	assertEqualString(exp, p);
	p = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_wcs(a, &mstr2, &wp));
	assertEqualWString(wexp, wp);
	wp = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_mbs_l(a, &mstr2, &p, &len, sc));
	assertEqualString(exp, p);
	assertEqualInt(len, strlen(exp));
	p = NULL;
	len = 0;

	archive_mstring_clean(&mstr2);
}